

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_portals.cxx
# Opt level: O3

void __thiscall level_tools::reconstruct_portals(level_tools *this)

{
  xr_level_portals *pxVar1;
  portal_data *ppVar2;
  char *pcVar3;
  xr_scene_portals *pxVar4;
  xr_scene_sectors *pxVar5;
  xr_portal_object *this_00;
  pointer pppVar6;
  xr_name_gen name;
  xr_name_gen local_68;
  vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *local_58;
  pointer local_50;
  pointer local_48;
  char *local_40;
  xr_portal_object *local_38;
  
  if (this->m_level->m_portals != (xr_level_portals *)0x0) {
    xray_re::msg("building %s","portal.part");
    pxVar1 = this->m_level->m_portals;
    pxVar4 = xray_re::xr_scene::portals(this->m_scene);
    local_58 = (vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
               &(pxVar4->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_58,(long)(pxVar1->m_portals).
                              super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pxVar1->m_portals).
                              super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    pxVar5 = xray_re::xr_scene::sectors(this->m_scene);
    if ((pxVar5->super_xr_scene_objects).m_objects.
        super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pxVar5->super_xr_scene_objects).m_objects.
        super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!sectors.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_portals.cxx"
                    ,0x16,"void level_tools::reconstruct_portals()");
    }
    xray_re::xr_name_gen::init(&local_68,(EVP_PKEY_CTX *)"portal");
    pppVar6 = (pxVar1->m_portals).
              super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_50 = (pxVar1->m_portals).
               super__Vector_base<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    while (pppVar6 != local_50) {
      ppVar2 = *pppVar6;
      local_48 = pppVar6;
      this_00 = (xr_portal_object *)operator_new(200);
      xray_re::xr_portal_object::xr_portal_object(this_00,this->m_scene);
      pcVar3 = local_68.m_name;
      local_40 = (char *)(this_00->super_xr_custom_object).m_name._M_string_length;
      strlen(local_68.m_name);
      std::__cxx11::string::_M_replace
                ((ulong)&(this_00->super_xr_custom_object).m_name,0,local_40,(ulong)pcVar3);
      std::__cxx11::string::_M_assign((string *)&this_00->m_sector_front);
      std::__cxx11::string::_M_assign((string *)&this_00->m_sector_back);
      std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
      _M_assign_aux<xray_re::_vector3<float>const*>
                ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
                 &this_00->m_vertices,&ppVar2->vertices,
                 (ppVar2->vertices).array + (ppVar2->vertices).count);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>(local_58,(xr_custom_object **)&local_38);
      pppVar6 = local_48 + 1;
      xray_re::xr_name_gen::next(&local_68);
    }
    xray_re::xr_level::clear_portals(this->m_level);
    operator_delete(local_68.m_name,1);
  }
  return;
}

Assistant:

void level_tools::reconstruct_portals()
{
	if (m_level->portals() == 0)
		return;
	msg("building %s", "portal.part");

	const portal_data_vec& portals = m_level->portals()->portals();
	xr_custom_object_vec& cobjects = m_scene->portals()->objects();
	cobjects.reserve(portals.size());

	xr_custom_object_vec& sectors = m_scene->sectors()->objects();
	xr_assert(!sectors.empty());

	xr_name_gen name("portal");
	for (portal_data_vec_cit it = portals.begin(), end = portals.end(); it != end; ++it, name.next()) {
		const portal_data* portal = *it;
		xr_portal_object* new_portal = new xr_portal_object(*m_scene);
		new_portal->co_name() = name.get();
		new_portal->sector_front() = sectors[portal->sector_front]->co_name();
		new_portal->sector_back() = sectors[portal->sector_back]->co_name();
		new_portal->vertices().assign(portal->vertices.begin(), portal->vertices.end());
		cobjects.push_back(new_portal);
	}
	m_level->clear_portals();
}